

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::args_will_forward
          (CompilerGLSL *this,uint32_t id,uint32_t *args,uint32_t num_args,bool pure)

{
  _Hash_node_base *p_Var1;
  size_t sVar2;
  uint32_t *puVar3;
  bool bVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  uVar8 = (this->super_Compiler).forced_temporaries._M_h._M_bucket_count;
  uVar5 = (ulong)id % uVar8;
  p_Var6 = (this->super_Compiler).forced_temporaries._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint32_t *)&p_Var6->_M_nxt[1]._M_nxt != id)) {
    while (p_Var6 = p_Var1, p_Var1 = p_Var6->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar8 != uVar5) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var1[1]._M_nxt == id)) goto LAB_0027f957;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0027f957:
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    bVar10 = num_args != 0;
    if (bVar10) {
      bVar4 = should_forward(this,*args);
      if (bVar4) {
        uVar8 = 0;
        do {
          if ((ulong)num_args - 1 == uVar8) goto LAB_0027f9b1;
          bVar10 = should_forward(this,args[uVar8 + 1]);
          uVar8 = uVar8 + 1;
        } while (bVar10);
        bVar10 = uVar8 < num_args;
      }
      if (bVar10) goto LAB_0027fa62;
    }
LAB_0027f9b1:
    if (!pure) {
      sVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
      bVar10 = sVar2 == 0;
      if (!bVar10) {
        puVar3 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
        bVar4 = should_forward(this,*puVar3);
        if (bVar4) {
          lVar9 = 4;
          do {
            bVar10 = sVar2 << 2 == lVar9;
            if (bVar10) goto LAB_0027fa0c;
            bVar4 = should_forward(this,*(uint32_t *)((long)puVar3 + lVar9));
            lVar9 = lVar9 + 4;
          } while (bVar4);
        }
        if (!bVar10) goto LAB_0027fa62;
      }
LAB_0027fa0c:
      sVar2 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.buffer_size;
      bVar10 = sVar2 == 0;
      if (!bVar10) {
        puVar3 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.ptr;
        bVar4 = should_forward(this,*puVar3);
        if (bVar4) {
          lVar9 = 4;
          do {
            bVar10 = sVar2 << 2 == lVar9;
            if (bVar10) goto LAB_0027fa5e;
            bVar4 = should_forward(this,*(uint32_t *)((long)puVar3 + lVar9));
            lVar9 = lVar9 + 4;
          } while (bVar4);
        }
        if (!bVar10) goto LAB_0027fa62;
      }
    }
LAB_0027fa5e:
    bVar10 = true;
  }
  else {
LAB_0027fa62:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool CompilerGLSL::args_will_forward(uint32_t id, const uint32_t *args, uint32_t num_args, bool pure)
{
	if (forced_temporaries.find(id) != end(forced_temporaries))
		return false;

	for (uint32_t i = 0; i < num_args; i++)
		if (!should_forward(args[i]))
			return false;

	// We need to forward globals as well.
	if (!pure)
	{
		for (auto global : global_variables)
			if (!should_forward(global))
				return false;
		for (auto aliased : aliased_variables)
			if (!should_forward(aliased))
				return false;
	}

	return true;
}